

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O0

int check_str(FitsKey *pkey,FILE *out)

{
  FILE *out_local;
  FitsKey *pkey_local;
  
  if ((pkey->ktype == UNKNOWN) && (pkey->kvalue[0] == '\0')) {
    sprintf(errmes,"Keyword #%d, %s has a null value; expected a string.",(ulong)(uint)pkey->kindex,
            pkey);
    wrterr(out,errmes,1);
    pkey_local._4_4_ = 0;
  }
  else if (pkey->ktype == STR_KEY) {
    pkey_local._4_4_ = 1;
  }
  else {
    sprintf(errmes,"Keyword #%d, %s: \"%s\" is not a string.",(ulong)(uint)pkey->kindex,pkey,
            pkey->kvalue);
    wrterr(out,errmes,1);
    pkey_local._4_4_ = 0;
  }
  return pkey_local._4_4_;
}

Assistant:

int check_str(FitsKey* pkey, FILE *out) 
{
    if(pkey->ktype == UNKNOWN && *(pkey->kvalue) == 0) {
        sprintf(errmes,"Keyword #%d, %s has a null value; expected a string.",
        pkey->kindex,pkey->kname);
        wrterr(out,errmes,1); 
        return 0;
    } else if(pkey->ktype != STR_KEY) { 
        sprintf(errmes,"Keyword #%d, %s: \"%s\" is not a string.",
        pkey->kindex,pkey->kname, pkey->kvalue);
        wrterr(out,errmes,1); 
        return 0;
    } 
    return 1;
}